

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::
join<std::__cxx11::string_const&,char_const(&)[13],unsigned_int,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [13],
          uint *ts_2,char **ts_3,char (*ts_4) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,char (*ts_6) [2],
          uint *ts_7,char (*ts_8) [3])

{
  undefined1 local_1138 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [4];
  char **ts_local_3;
  uint *ts_local_2;
  char (*ts_local_1) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1138);
  inner::
  join_helper<std::__cxx11::string_const&,char_const(&)[13],unsigned_int,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [13])ts,(uint *)ts_1,(char **)ts_2,
             (char (*) [4])stream.saved_buffers.stack_storage.aligned_char._184_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,
             (char (*) [2])ts_5,(uint *)ts_6,(char (*) [3])ts_7);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1138);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1138);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}